

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  u8 i;
  RunResult RVar1;
  RunResult RVar2;
  long lVar3;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__b_> local_20;
  Value local_18;
  
  RVar1 = Load<wabt::interp::Simd<unsigned_char,(unsigned_char)8>>(this,instr,&local_20,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    lVar3 = 0;
    do {
      *(ushort *)((long)&local_18 + lVar3 * 2) = (ushort)local_20.v[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    Push(this,local_18);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[i];
  }
  Push(result);
  return RunResult::Ok;
}